

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

uint __thiscall libmatroska::KaxBlockGroup::ReferenceCount(KaxBlockGroup *this)

{
  EbmlElement *PastElt;
  uint uVar1;
  
  PastElt = libebml::EbmlMaster::FindFirstElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxReferenceBlock::ClassInfos);
  uVar1 = 0;
  while (PastElt != (EbmlElement *)0x0) {
    PastElt = libebml::EbmlMaster::FindNextElt(&this->super_EbmlMaster,PastElt);
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

unsigned int KaxBlockGroup::ReferenceCount() const
{
  unsigned int Result = 0;
  KaxReferenceBlock * MyBlockAdds = static_cast<KaxReferenceBlock *>(FindFirstElt(EBML_INFO(KaxReferenceBlock)));
  if (MyBlockAdds != NULL) {
    Result++;
    while ((MyBlockAdds = static_cast<KaxReferenceBlock *>(FindNextElt(*MyBlockAdds))) != NULL) {
      Result++;
    }
  }
  return Result;
}